

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_set.hpp
# Opt level: O1

void Omega_h::unite_with<char>
               (set<char,_std::less<char>,_std::allocator<char>_> *a,
               set<char,_std::less<char>,_std::allocator<char>_> *b)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (b->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(b->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
    _M_insert_unique<char_const&>
              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)a,
               (char *)(p_Var1 + 1));
  }
  return;
}

Assistant:

void unite_with(std::set<T>& a, std::set<T> const& b) {
  for (auto& x : b) a.insert(x);
}